

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O0

void __thiscall LinePrinter::Print(LinePrinter *this,string *to_print,LineType type)

{
  int iVar1;
  undefined8 uVar2;
  string local_48;
  undefined1 local_24 [2];
  ushort local_22;
  winsize size;
  LineType type_local;
  string *to_print_local;
  LinePrinter *this_local;
  
  size._0_4_ = type;
  unique0x10000191 = to_print;
  if ((this->console_locked_ & 1U) == 0) {
    if ((this->smart_terminal_ & 1U) != 0) {
      printf("\r");
    }
    if (((this->smart_terminal_ & 1U) == 0) || (size._0_4_ != 1)) {
      uVar2 = std::__cxx11::string::c_str();
      printf("%s\n",uVar2);
    }
    else {
      iVar1 = ioctl(1,0x5413,local_24);
      if ((iVar1 == 0) && (local_22 != 0)) {
        ElideMiddle(&local_48,to_print,(ulong)local_22);
        std::__cxx11::string::operator=((string *)to_print,(string *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
      }
      uVar2 = std::__cxx11::string::c_str();
      printf("%s",uVar2);
      printf("\x1b[K");
      fflush(_stdout);
      this->have_blank_line_ = false;
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->line_buffer_,(string *)to_print);
    this->line_type_ = size._0_4_;
  }
  return;
}

Assistant:

void LinePrinter::Print(string to_print, LineType type) {
  if (console_locked_) {
    line_buffer_ = to_print;
    line_type_ = type;
    return;
  }

  if (smart_terminal_) {
    printf("\r");  // Print over previous line, if any.
    // On Windows, calling a C library function writing to stdout also handles
    // pausing the executable when the "Pause" key or Ctrl-S is pressed.
  }

  if (smart_terminal_ && type == ELIDE) {
#ifdef _WIN32
    CONSOLE_SCREEN_BUFFER_INFO csbi;
    GetConsoleScreenBufferInfo(console_, &csbi);

    to_print = ElideMiddle(to_print, static_cast<size_t>(csbi.dwSize.X));
    if (supports_color_) {  // this means ENABLE_VIRTUAL_TERMINAL_PROCESSING
                            // succeeded
      printf("%s\x1B[K", to_print.c_str());  // Clear to end of line.
      fflush(stdout);
    } else {
      // We don't want to have the cursor spamming back and forth, so instead of
      // printf use WriteConsoleOutput which updates the contents of the buffer,
      // but doesn't move the cursor position.
      COORD buf_size = { csbi.dwSize.X, 1 };
      COORD zero_zero = { 0, 0 };
      SMALL_RECT target = { csbi.dwCursorPosition.X, csbi.dwCursorPosition.Y,
                            static_cast<SHORT>(csbi.dwCursorPosition.X +
                                               csbi.dwSize.X - 1),
                            csbi.dwCursorPosition.Y };
      vector<CHAR_INFO> char_data(csbi.dwSize.X);
      for (size_t i = 0; i < static_cast<size_t>(csbi.dwSize.X); ++i) {
        char_data[i].Char.AsciiChar = i < to_print.size() ? to_print[i] : ' ';
        char_data[i].Attributes = csbi.wAttributes;
      }
      WriteConsoleOutput(console_, &char_data[0], buf_size, zero_zero, &target);
    }
#else
    // Limit output to width of the terminal if provided so we don't cause
    // line-wrapping.
    winsize size;
    if ((ioctl(STDOUT_FILENO, TIOCGWINSZ, &size) == 0) && size.ws_col) {
      to_print = ElideMiddle(to_print, size.ws_col);
    }
    printf("%s", to_print.c_str());
    printf("\x1B[K");  // Clear to end of line.
    fflush(stdout);
#endif

    have_blank_line_ = false;
  } else {
    printf("%s\n", to_print.c_str());
  }
}